

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# List.h
# Opt level: O0

void __thiscall
Js::
CopyRemovePolicy<JsUtil::List<Js::Probe_*,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>,_true>
::Remove(CopyRemovePolicy<JsUtil::List<Js::Probe_*,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>,_true>
         *this,List<Js::Probe_*,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
               *list,TElementType *item)

{
  Type ppPVar1;
  bool bVar2;
  Type *pTVar3;
  int local_38;
  int local_34;
  int j;
  int i;
  int *count;
  TElementType *buffer;
  TElementType *item_local;
  List<Js::Probe_*,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
  *list_local;
  CopyRemovePolicy<JsUtil::List<Js::Probe_*,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>,_true>
  *this_local;
  
  ppPVar1 = (list->super_ReadOnlyList<Js::Probe_*,_Memory::ArenaAllocator,_DefaultComparer>).buffer;
  pTVar3 = &(list->super_ReadOnlyList<Js::Probe_*,_Memory::ArenaAllocator,_DefaultComparer>).count;
  local_34 = 0;
  while( true ) {
    if (*pTVar3 <= local_34) {
      return;
    }
    bVar2 = DefaultComparer<Js::Probe_*>::Equals(ppPVar1[local_34],*item);
    local_38 = local_34;
    if (bVar2) break;
    local_34 = local_34 + 1;
  }
  while (local_38 = local_38 + 1, local_38 < *pTVar3) {
    ppPVar1[local_34] = ppPVar1[local_38];
    local_34 = local_34 + 1;
  }
  *pTVar3 = *pTVar3 + -1;
  Memory::ClearArray<Js::Probe*>(ppPVar1 + *pTVar3,1);
  return;
}

Assistant:

void Remove(TListType* list, const TElementType& item)
        {
            TElementType* buffer = list->buffer;
            int& count = list->count;

            for (int i = 0; i < count; i++)
            {
                if (TComparerType::Equals(buffer[i], item))
                {
                    for (int j = i + 1; j < count; i++, j++)
                    {
                        buffer[i] = buffer[j];
                    }
                    count--;

                    if (clearOldEntries)
                    {
                        ClearArray(buffer + count, 1);
                    }
                    break;
                }
            }
        }